

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

bool mkvmuxer::WriteEbmlElement(IMkvWriter *writer,uint64 type,uint8 *value,uint64 size)

{
  int32 iVar1;
  int iVar2;
  uint64 size_local;
  uint8 *value_local;
  uint64 type_local;
  IMkvWriter *writer_local;
  
  if (((writer == (IMkvWriter *)0x0) || (value == (uint8 *)0x0)) || (size == 0)) {
    writer_local._7_1_ = false;
  }
  else {
    iVar1 = WriteID(writer,type);
    if (iVar1 == 0) {
      iVar1 = WriteUInt(writer,size);
      if (iVar1 == 0) {
        iVar2 = (**writer->_vptr_IMkvWriter)(writer,value,size & 0xffffffff);
        if (iVar2 == 0) {
          writer_local._7_1_ = true;
        }
        else {
          writer_local._7_1_ = false;
        }
      }
      else {
        writer_local._7_1_ = false;
      }
    }
    else {
      writer_local._7_1_ = false;
    }
  }
  return writer_local._7_1_;
}

Assistant:

bool WriteEbmlElement(IMkvWriter* writer, uint64 type, const uint8* value,
                      uint64 size) {
  if (!writer || !value || size < 1)
    return false;

  if (WriteID(writer, type))
    return false;

  if (WriteUInt(writer, size))
    return false;

  if (writer->Write(value, static_cast<uint32>(size)))
    return false;

  return true;
}